

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Imputer::clear_ImputedValue(Imputer *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  Int64ToDoubleMap *this_00;
  
  switch(this->_oneof_case_[0]) {
  case 3:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&this->ImputedValue_,puVar1);
    goto switchD_00222516_default;
  case 4:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputeddoublearray_,
       this_00 == (Int64ToDoubleMap *)0x0)) goto switchD_00222516_default;
    DoubleVector::~DoubleVector((DoubleVector *)this_00);
    break;
  case 5:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputedint64array_,
       this_00 == (Int64ToDoubleMap *)0x0)) goto switchD_00222516_default;
    Int64Vector::~Int64Vector((Int64Vector *)this_00);
    break;
  case 6:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputedstringdictionary_,
       this_00 == (Int64ToDoubleMap *)0x0)) goto switchD_00222516_default;
    StringToDoubleMap::~StringToDoubleMap((StringToDoubleMap *)this_00);
    goto LAB_002225bf;
  case 7:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (this->ImputedValue_).imputedint64dictionary_, this_00 == (Int64ToDoubleMap *)0x0)
       ) goto switchD_00222516_default;
    Int64ToDoubleMap::~Int64ToDoubleMap(this_00);
LAB_002225bf:
    uVar2 = 0x48;
    goto LAB_002225f1;
  default:
    goto switchD_00222516_default;
  }
  uVar2 = 0x28;
LAB_002225f1:
  operator_delete(this_00,uVar2);
switchD_00222516_default:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Imputer::clear_ImputedValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ImputedValue_case()) {
    case kImputedDoubleValue: {
      // No need to clear
      break;
    }
    case kImputedInt64Value: {
      // No need to clear
      break;
    }
    case kImputedStringValue: {
      ImputedValue_.imputedstringvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case kImputedDoubleArray: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputeddoublearray_;
      }
      break;
    }
    case kImputedInt64Array: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64array_;
      }
      break;
    }
    case kImputedStringDictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedstringdictionary_;
      }
      break;
    }
    case kImputedInt64Dictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64dictionary_;
      }
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = IMPUTEDVALUE_NOT_SET;
}